

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O0

void __thiscall
FShaderProgram::Compile
          (FShaderProgram *this,ShaderType type,char *lumpName,char *defines,int maxGlslVersion)

{
  char *copyStr;
  undefined1 local_48 [16];
  FString local_38;
  FString code;
  int lump;
  int maxGlslVersion_local;
  char *defines_local;
  char *lumpName_local;
  ShaderType type_local;
  FShaderProgram *this_local;
  
  code.Chars._4_4_ = maxGlslVersion;
  code.Chars._0_4_ = FWadCollection::CheckNumForFullName(&Wads,lumpName,false,0);
  if ((int)code.Chars == -1) {
    I_FatalError("Unable to load \'%s\'",lumpName);
  }
  FWadCollection::ReadLump((FWadCollection *)local_48,0xdb0460);
  FMemLump::GetString((FMemLump *)(local_48 + 8));
  copyStr = FString::GetChars((FString *)(local_48 + 8));
  FString::FString(&local_38,copyStr);
  FString::~FString((FString *)(local_48 + 8));
  FMemLump::~FMemLump((FMemLump *)local_48);
  Compile(this,type,lumpName,&local_38,defines,code.Chars._4_4_);
  FString::~FString(&local_38);
  return;
}

Assistant:

void FShaderProgram::Compile(ShaderType type, const char *lumpName, const char *defines, int maxGlslVersion)
{
	int lump = Wads.CheckNumForFullName(lumpName);
	if (lump == -1) I_FatalError("Unable to load '%s'", lumpName);
	FString code = Wads.ReadLump(lump).GetString().GetChars();
	Compile(type, lumpName, code, defines, maxGlslVersion);
}